

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

vec3d_t * vec3d_add_n(vec3d_t *__return_storage_ptr__,vec3d_t v0,double n)

{
  (__return_storage_ptr__->field_0).x = n + v0.field_0.x;
  (__return_storage_ptr__->field_0).y = n + v0.field_0.y;
  (__return_storage_ptr__->field_0).z = n + v0.field_0.z;
  return __return_storage_ptr__;
}

Assistant:

vec3d_t vec3d_add_n(
        vec3d_t v0,
        double  n)
{
    return (vec3d_t)
    { 
        .x = v0.x + n,
        .y = v0.y + n,
        .z = v0.z + n
    };
}